

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O0

int nn_xsub_recv(nn_sockbase *self,nn_msg *msg)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  uint8_t *data;
  size_t size;
  nn_sockbase *local_38;
  nn_xsub *xsub;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  while( true ) {
    iVar2 = nn_fq_recv((nn_fq *)(local_38 + 1),msg,(nn_pipe **)0x0);
    pFVar1 = _stderr;
    if (iVar2 == -0xb) {
      return -0xb;
    }
    if (iVar2 < 0) break;
    data = (uint8_t *)nn_chunkref_data(&msg->body);
    size = nn_chunkref_size(&msg->body);
    iVar2 = nn_trie_match((nn_trie *)&local_38[0x19].sock,data,size);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      if (iVar2 == 1) {
        return 0;
      }
      pcVar3 = nn_err_strerror(-iVar2);
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
              ,0xb8);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_term(msg);
  }
  pcVar3 = nn_err_strerror(-iVar2);
  fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
          ,0xaf);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xsub_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    /*  Loop while a matching message is found or when there are no more
        messages to receive. */
    while (1) {
        rc = nn_fq_recv (&xsub->fq, msg, NULL);
        if (nn_slow (rc == -EAGAIN))
            return -EAGAIN;
        errnum_assert (rc >= 0, -rc);
        rc = nn_trie_match (&xsub->trie, nn_chunkref_data (&msg->body),
            nn_chunkref_size (&msg->body));
        if (rc == 0) {
            nn_msg_term (msg);
            continue;
        }
        if (rc == 1)
            return 0;
        errnum_assert (0, -rc);
    }
}